

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_allocate_delete.c
# Opt level: O2

int test_kvtree_allocate_delete(void)

{
  bool bVar1;
  kvtree *kvtree;
  long local_18;
  
  local_18 = kvtree_new();
  bVar1 = local_18 == 0;
  kvtree_delete(&local_18);
  return (int)(local_18 != 0 || bVar1);
}

Assistant:

int test_kvtree_allocate_delete(){
  int rc = TEST_PASS;

  kvtree* kvtree = kvtree_new();
  if (kvtree == NULL) rc = TEST_FAIL;

  kvtree_delete(&kvtree);
  if (kvtree != NULL) rc = TEST_FAIL;

  return rc;
}